

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Cloner::RetargetClonedBranches(Cloner *this)

{
  BranchInstr *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BranchInstr *pBVar5;
  BranchInstr *this_00;
  BranchInstr *pBVar6;
  
  if (this->fRetargetClonedBranch != 0) {
    if (this->instrLast == (Instr *)0x0) {
      pBVar6 = (BranchInstr *)0x0;
    }
    else {
      pBVar6 = (BranchInstr *)this->instrLast->m_next;
    }
    this_00 = (BranchInstr *)this->instrFirst;
    if (this_00 != pBVar6) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      pBVar5 = (BranchInstr *)0x0;
      do {
        if ((pBVar5 != (BranchInstr *)0x0) &&
           ((BranchInstr *)(pBVar5->super_Instr).m_next != this_00)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                             ,0x78d,
                             "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                             "Modifying instr list but not using EDITING iterator!");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        if ((this_00->super_Instr).m_kind == InstrKindBranch) {
          IR::BranchInstr::RetargetClonedBranch(this_00);
        }
        pBVar1 = (BranchInstr *)(this_00->super_Instr).m_next;
        pBVar5 = this_00;
        this_00 = pBVar1;
      } while (pBVar1 != pBVar6);
    }
  }
  return;
}

Assistant:

void
Cloner::RetargetClonedBranches()
{
    if (!this->fRetargetClonedBranch)
    {
        return;
    }

    FOREACH_INSTR_IN_RANGE(instr, this->instrFirst, this->instrLast)
    {
        if (instr->IsBranchInstr())
        {
            instr->AsBranchInstr()->RetargetClonedBranch();
        }
    }
    NEXT_INSTR_IN_RANGE;
}